

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

int try_lift(monst *mtmp,trap *ttmp,int wt,boolean stuff)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  
  iVar2 = weight_cap();
  if ((wt * 2) / iVar2 < 3) {
    return 1;
  }
  pcVar5 = Monnam(mtmp);
  pcVar8 = "carrying too much";
  if (stuff == '\0') {
    pcVar8 = "too heavy";
  }
  pline("%s is %s for you to lift.",pcVar5,pcVar8);
  if ((char)ttmp->field_0x8 < '\0') {
    return 0;
  }
  if ((*(uint *)&mtmp->field_0x60 & 0x440000) != 0x40000) {
    return 0;
  }
  if ((mtmp->data->mflags1 & 0x10000) != 0) {
    return 0;
  }
  if (mtmp->data->mlet == '5') {
    return 0;
  }
  uVar3 = mt_random();
  uVar3 = uVar3 % 10;
  lVar7 = (long)u.uluck;
  lVar6 = (long)u.moreluck;
  if (((int)(lVar6 + lVar7) != 0) &&
     (uVar4 = mt_random(), SUB168(ZEXT416(uVar4) % SEXT816(0x32 - (lVar6 + lVar7)),0) != 0)) {
    iVar2 = (int)u.moreluck + (int)u.uluck;
    if (-6 < iVar2) {
      sVar1 = (short)((uint)(iVar2 * 0x5556) >> 0x10);
      iVar2 = (int)(short)(sVar1 - (sVar1 >> 0xf));
    }
    uVar3 = uVar3 - iVar2;
    if ((int)uVar3 < 0) goto LAB_0026f14b;
    if (9 < uVar3) {
      return 0;
    }
  }
  if (2 < uVar3) {
    return 0;
  }
LAB_0026f14b:
  mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
  set_malign(mtmp);
  pcVar5 = Monnam(mtmp);
  pline("%s thinks it was nice of you to try.",pcVar5);
  return 0;
}

Assistant:

static int try_lift(struct monst *mtmp, struct trap *ttmp, int wt, boolean stuff)
{
	int wc = weight_cap();

	if (((wt * 2) / wc) >= HVY_ENCUMBER) {
	    pline("%s is %s for you to lift.", Monnam(mtmp),
		  stuff ? "carrying too much" : "too heavy");
	    if (!ttmp->madeby_u && !mtmp->mpeaceful && mtmp->mcanmove &&
		    !mindless(mtmp->data) &&
		    mtmp->data->mlet != S_HUMAN && rnl(10) < 3) {
		mtmp->mpeaceful = 1;
		set_malign(mtmp);		/* reset alignment */
		pline("%s thinks it was nice of you to try.", Monnam(mtmp));
	    }
	    return 0;
	}
	return 1;
}